

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

MeasuredBRDF * pbrt::MeasuredBxDF::BRDFDataFromFile(string *filename,Allocator alloc)

{
  iterator iVar1;
  MeasuredBRDF *pMVar2;
  mapped_type *ppMVar3;
  
  if (BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)::
      loadedData_abi_cxx11_ == '\0') {
    BRDFDataFromFile();
  }
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*>_>_>
          ::find(&BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
                  ::loadedData_abi_cxx11_._M_t,filename);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)::
       loadedData_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    pMVar2 = MeasuredBRDF::Create(filename,alloc);
    ppMVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*>_>_>
              ::operator[](&BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
                            ::loadedData_abi_cxx11_,filename);
    *ppMVar3 = pMVar2;
  }
  ppMVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MeasuredBRDF_*>_>_>
            ::operator[](&BRDFDataFromFile(std::__cxx11::string_const&,pstd::pmr::polymorphic_allocator<std::byte>)
                          ::loadedData_abi_cxx11_,filename);
  return *ppMVar3;
}

Assistant:

MeasuredBRDF *MeasuredBxDF::BRDFDataFromFile(const std::string &filename,
                                             Allocator alloc) {
    static std::map<std::string, MeasuredBRDF *> loadedData;
    if (loadedData.find(filename) == loadedData.end())
        loadedData[filename] = MeasuredBRDF::Create(filename, alloc);
    return loadedData[filename];
}